

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O0

int lws_mqtt_vbi_encode(uint32_t value,void *buf)

{
  byte bVar1;
  byte *pbStack_20;
  uint8_t b;
  uint8_t *p;
  void *buf_local;
  uint32_t value_local;
  
  pbStack_20 = (byte *)buf;
  buf_local._4_4_ = value;
  if (value < 0x10000000) {
    do {
      bVar1 = (byte)buf_local._4_4_ & 0x7f;
      buf_local._4_4_ = buf_local._4_4_ >> 7;
      if (buf_local._4_4_ == 0) {
        *pbStack_20 = bVar1;
      }
      else {
        *pbStack_20 = bVar1 | 0x80;
      }
      pbStack_20 = pbStack_20 + 1;
    } while (buf_local._4_4_ != 0);
    return (int)pbStack_20 - (int)buf;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/mqtt/primitives.c"
                ,0x32,"int lws_mqtt_vbi_encode(uint32_t, void *)");
}

Assistant:

int
lws_mqtt_vbi_encode(uint32_t value, void *buf)
{
	uint8_t *p = (uint8_t *)buf, b;

	if (value > 0xfffffff) {
		assert(0);
		return -1;
	}

	do {
		b = value & 0x7f;
		value >>= 7;
		if (value)
			*p++ = (0x80 | b);
		else
			*p++ = b;
	} while (value);

	return p - (uint8_t *)buf;
}